

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O0

int soplex::dlcmSizeRational(Rational *vector,int length,int base)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  int size;
  int i;
  Integer lcm;
  empty_value<std::allocator<unsigned_long_long>,_0U,_true> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  data_type *in_stack_fffffffffffffdf0;
  Integer *in_stack_fffffffffffffdf8;
  Integer *in_stack_fffffffffffffe00;
  data_type *local_1e8;
  undefined4 in_stack_fffffffffffffe28;
  uint uVar3;
  undefined1 local_1b8 [8];
  uint in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *in_stack_fffffffffffffe58;
  data_type local_138 [4];
  int in_stack_fffffffffffffecc;
  data_type *in_stack_fffffffffffffed0;
  int local_110;
  undefined4 local_10c;
  Integer local_108;
  int local_dc;
  undefined8 local_d0;
  undefined4 *local_c8;
  Integer *local_c0;
  undefined4 *local_b8;
  undefined8 local_b0;
  long local_a8;
  Integer *local_a0;
  long local_98;
  Integer *local_90;
  Integer *local_88;
  data_type *local_80;
  Integer *local_78;
  data_type *local_70;
  Integer *local_58;
  data_type *local_50;
  data_type *local_48;
  Integer *local_40;
  Integer *local_38;
  Integer *local_30;
  Integer *local_28;
  undefined8 local_20;
  Integer *local_18;
  undefined1 *local_10;
  Integer *local_8;
  
  local_10c = 1;
  local_c0 = &local_108;
  local_c8 = &local_10c;
  local_d0 = 0;
  local_a8 = 1;
  local_b0 = 0;
  local_dc = in_ESI;
  local_b8 = local_c8;
  local_a0 = local_c0;
  local_98 = local_a8;
  local_90 = local_c0;
  boost::empty_::empty_value<std::allocator<unsigned_long_long>,_0U,_true>::empty_value
            ((empty_value<std::allocator<unsigned_long_long>,_0U,_true> *)0x44f7c5);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::data_type::data_type
            (in_stack_fffffffffffffdf0,CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
            );
  local_108.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  local_108.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = local_98 < 0;
  local_108.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  local_108.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  for (local_110 = 0; local_110 < local_dc; local_110 = local_110 + 1) {
    local_88 = &local_108;
    local_80 = local_138;
    local_78 = local_88;
    local_70 = local_138;
    local_58 = local_88;
    local_50 = local_138;
    boost::empty_::empty_value<std::allocator<unsigned_long_long>,_0U,_true>::empty_value
              ((empty_value<std::allocator<unsigned_long_long>,_0U,_true> *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::data_type::data_type(local_138);
    if (((local_58->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_alias & 1U) == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (local_58->m_backend).
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_limbs;
    }
    bVar1 = (local_58->m_backend).
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_alias;
    if (((local_58->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_alias & 1U) == 0) {
      local_30 = local_58;
      local_38 = local_58;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
      local_1e8 = in_stack_fffffffffffffed0;
      if (((bVar1 & 1U) - 1 & 1) != 0) {
        local_1e8 = local_138;
      }
      local_28 = local_58;
      in_stack_fffffffffffffe00 = local_58;
      if (((local_58->m_backend).
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_internal & 1U) == 0) {
        in_stack_fffffffffffffe00 =
             (Integer *)
             (local_58->m_backend).
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_data.ld.data;
      }
      local_40 = local_58;
      local_48 = local_138;
      memcpy(local_1e8,in_stack_fffffffffffffe00,
             (ulong)(local_58->m_backend).
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_limbs << 3);
    }
    else {
      in_stack_fffffffffffffecc =
           (int)((local_58->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.la[0] >> 0x20);
      in_stack_fffffffffffffed0 =
           (data_type *)
           (local_58->m_backend).
           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
           .m_data.ld.data;
    }
    boost::multiprecision::
    denominator<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                *)CONCAT44(uVar3,in_stack_fffffffffffffe28));
    SpxLcm(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
           (Integer *)&in_stack_fffffffffffffdf0->ld);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x44facb);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x44fad8);
  }
  local_10 = local_1b8;
  local_18 = &local_108;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)in_stack_fffffffffffffdd8);
  iVar2 = sizeInBase((Rational *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  iVar2 = iVar2 + 1;
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x44fbe2);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x44fc05);
  return iVar2;
}

Assistant:

inline int dlcmSizeRational(const Rational* vector, const int length, const int base)
{
   assert(vector != nullptr);
   assert(length >= 0);

#ifndef SOPLEX_WITH_BOOST
   SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
   return 0;
#else

   Integer lcm = 1;

   for(int i = 0; i < length; i++)
      SpxLcm(lcm, lcm, denominator(vector[i]));

   int size = sizeInBase(Rational(lcm), base) + 1;

   return size;
#endif
}